

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O1

char * flags_to_string(CHAR_DATA *ch,flag_type *showflags,int flagsperline)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  char temp_value [4608];
  undefined8 local_1228;
  undefined7 uStack_1220;
  undefined1 uStack_1219;
  undefined7 uStack_1218;
  char acStack_1211 [4585];
  
  local_1228 = local_1228 & 0xffffffffffffff00;
  pcVar2 = showflags->name;
  if (pcVar2 != (char *)0x0) {
    iVar3 = 1;
    do {
      strcat((char *)&local_1228,pcVar2);
      sVar1 = strlen((char *)&local_1228);
      if (iVar3 % flagsperline == 0) {
        *(undefined1 *)((long)&local_1228 + sVar1 + 2) = 0;
        *(undefined2 *)((long)&local_1228 + sVar1) = 0xd0a;
      }
      else {
        *(undefined2 *)((long)&local_1228 + sVar1) = 0x20;
      }
      iVar3 = iVar3 + 1;
    } while (pcVar2 != (char *)0x0);
  }
  if ((char)local_1228 == '\0') {
    uStack_1218 = 0x6e2067616c6620;
    builtin_strncpy(acStack_1211,"ames.\n\r",8);
    local_1228._0_1_ = 'E';
    local_1228._1_1_ = 'r';
    local_1228._2_1_ = 'r';
    local_1228._3_1_ = 'o';
    local_1228._4_1_ = 'r';
    local_1228._5_1_ = ' ';
    local_1228._6_1_ = 'l';
    local_1228._7_1_ = 'o';
    uStack_1220 = 0x7520676e696b6f;
    uStack_1219 = 0x70;
  }
  pcVar2 = palloc_string((char *)&local_1228);
  return pcVar2;
}

Assistant:

char *flags_to_string(CHAR_DATA *ch, const struct flag_type *showflags, int flagsperline)
{
	int flag, col = 0;
	char temp_value[MAX_INPUT_LENGTH];
	temp_value[0] = '\0';

	for (flag = 0; showflags[flag].name != nullptr; flag = flag++)
	{
		strcat(temp_value, showflags[flag].name);

		if (++col % flagsperline == 0)
			strcat(temp_value, "\n\r");
		else
			strcat(temp_value, " ");
	}

	if (temp_value[0] == '\0')
		sprintf(temp_value, "Error looking up flag names.\n\r");

	return palloc_string(temp_value);
}